

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScanDepFormat.cxx
# Opt level: O1

bool cmScanDepFormat_P1689_Parse(string *arg_pp,cmScanDepInfo *info)

{
  size_type sVar1;
  cmScanDepInfo *pcVar2;
  LookupMethod LVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  UInt UVar7;
  ArrayIndex AVar8;
  int iVar9;
  Value *pVVar10;
  Value *pVVar11;
  Value *pVVar12;
  undefined8 uVar13;
  _Alloc_hider _Var14;
  size_type __rlen;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_06;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_07;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_08;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_09;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_10;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_11;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_12;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_13;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_14;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_15;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_16;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_17;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_18;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_19;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_20;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_21;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_22;
  const_iterator cVar15;
  string wd;
  string extra_output;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  work_directory;
  Reader reader;
  Value ppio;
  ifstream ppf;
  string local_4a0;
  pointer local_480;
  undefined8 local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_468;
  String *local_460;
  string *local_458;
  string local_450;
  String local_418;
  char local_3f8;
  ValueIteratorBase local_3f0;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  undefined2 local_380;
  LookupMethod local_37c;
  _Alloc_hider local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330 [3];
  _Alloc_hider local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  cmScanDepInfo *local_2d0;
  string local_2c8;
  SelfType local_2a8;
  ValueIteratorBase local_298;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_288;
  vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *local_280;
  vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *local_278;
  Value local_270;
  SelfType local_248;
  istream local_238;
  
  local_2d0 = info;
  Json::Value::Value(&local_270,nullValue);
  local_458 = arg_pp;
  std::ifstream::ifstream(&local_238,(arg_pp->_M_dataplus)._M_p,_S_in|_S_bin);
  Json::Reader::Reader((Reader *)local_3e0);
  bVar4 = Json::Reader::parse((Reader *)local_3e0,&local_238,&local_270,false);
  pcVar2 = local_2d0;
  if (bVar4) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_p != &local_2e8) {
      operator_delete(local_2f8._M_p,local_2e8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_p != local_330) {
      operator_delete(local_340._M_p,local_330[0]._M_allocated_capacity + 1);
    }
    std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
              ((deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *)
               &local_390);
    std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
              ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)local_3e0);
LAB_006a9893:
    pVVar10 = Json::Value::operator[](&local_270,"version");
    UVar7 = Json::Value::asUInt(pVVar10);
    if (UVar7 < 2) {
      pVVar10 = Json::Value::operator[](&local_270,"rules");
      bVar4 = Json::Value::isArray(pVVar10);
      if (bVar4) {
        AVar8 = Json::Value::size(pVVar10);
        if (AVar8 != 1) {
          local_3e0._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x26;
          local_3e0._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
          local_3e0._16_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_3c0._0_8_ = (local_458->_M_dataplus)._M_p;
          local_3e0._24_8_ = local_458->_M_string_length;
          local_3c0._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_3c0._16_8_ = &DAT_00000019;
          local_3c0._24_8_ = ": expected 1 source entry";
          local_3a0._M_allocated_capacity = 0;
          views_22._M_len = 3;
          views_22._M_array = (iterator)local_3e0;
          cmCatViews(&local_4a0,views_22);
          cmSystemTools::Error(&local_4a0);
          local_418.field_2._M_allocated_capacity = local_4a0.field_2._M_allocated_capacity;
          local_418._M_dataplus._M_p = local_4a0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) goto LAB_006a9977;
          goto LAB_006a997f;
        }
        cVar15 = Json::Value::begin(pVVar10);
        local_298.current_ = cVar15.super_ValueIteratorBase.current_._M_node;
        local_298.isNull_ = cVar15.super_ValueIteratorBase.isNull_;
        cVar15 = Json::Value::end(pVVar10);
        local_248.current_ = cVar15.super_ValueIteratorBase.current_._M_node;
        local_248.isNull_ = cVar15.super_ValueIteratorBase.isNull_;
        local_288 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                    &pcVar2->ExtraOutputs;
        local_278 = &pcVar2->Provides;
        local_280 = &pcVar2->Requires;
        while (bVar4 = Json::ValueIteratorBase::isEqual(&local_298,&local_248), !bVar4) {
          pVVar10 = Json::ValueIteratorBase::deref(&local_298);
          local_3f8 = '\0';
          pVVar11 = Json::Value::operator[](pVVar10,"work-directory");
          bVar4 = Json::Value::isString(pVVar11);
          if (!bVar4) {
            bVar4 = Json::Value::isNull(pVVar11);
            if (bVar4) goto LAB_006a9b8c;
            cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[33]>
                      ((string *)local_3e0,(char (*) [39])"-E cmake_ninja_dyndep failed to parse ",
                       local_458,(char (*) [33])": work-directory is not a string");
            cmSystemTools::Error((string *)local_3e0);
LAB_006ab3ea:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3e0._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_3e0 + 0x10)) {
              operator_delete((void *)local_3e0._0_8_,(ulong)(local_3e0._16_8_ + 1));
            }
LAB_006ab40f:
            if ((local_3f8 != '\x01') ||
               (local_3f8 = '\0',
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_418._M_dataplus._M_p == &local_418.field_2)) goto LAB_006a997f;
            goto LAB_006a9977;
          }
          local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
          local_4a0._M_string_length = 0;
          local_4a0.field_2._M_allocated_capacity =
               local_4a0.field_2._M_allocated_capacity & 0xffffffffffffff00;
          bVar4 = ParseFilename(pVVar11,&local_4a0);
          if (bVar4) {
            std::optional<std::__cxx11::string>::operator=
                      ((optional<std::__cxx11::string> *)&local_418,&local_4a0);
          }
          else {
            local_3e0._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x26;
            local_3e0._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
            local_3e0._16_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_3c0._0_8_ = (local_458->_M_dataplus)._M_p;
            local_3e0._24_8_ = local_458->_M_string_length;
            local_3c0._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_3c0._16_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0xe;
            local_3c0._24_8_ = ": invalid blob";
            local_3a0._M_allocated_capacity = 0;
            views_01._M_len = 3;
            views_01._M_array = (iterator)local_3e0;
            cmCatViews(&local_450,views_01);
            cmSystemTools::Error(&local_450);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_450._M_dataplus._M_p != &local_450.field_2) {
              operator_delete(local_450._M_dataplus._M_p,
                              (ulong)(local_450.field_2._M_allocated_capacity + 1));
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
            operator_delete(local_4a0._M_dataplus._M_p,
                            (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
          }
          if (!bVar4) goto LAB_006ab40f;
LAB_006a9b8c:
          bVar4 = Json::Value::isMember(pVVar10,"primary-output");
          if (bVar4) {
            pVVar11 = Json::Value::operator[](pVVar10,"primary-output");
            bVar4 = ParseFilename(pVVar11,&local_2d0->PrimaryOutput);
            if (bVar4) {
              if (((local_3f8 == '\x01') &&
                  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_418._M_string_length !=
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0)) &&
                 (bVar5 = cmsys::SystemTools::FileIsFullPath(&local_2d0->PrimaryOutput),
                 pcVar2 = local_2d0, !bVar5)) {
                local_3e0._0_8_ = local_418._M_string_length;
                local_3e0._8_8_ = local_418._M_dataplus._M_p;
                local_3e0._16_8_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                local_4a0._M_dataplus._M_p = (pointer)0x0;
                local_4a0._M_string_length = (size_type)&DAT_00000001;
                local_4a0.field_2._M_allocated_capacity = (long)&local_4a0.field_2 + 8;
                local_4a0.field_2._M_local_buf[8] = 0x2f;
                local_3e0._24_8_ = &DAT_00000001;
                local_3c0._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_3c0._24_8_ = (local_2d0->PrimaryOutput)._M_dataplus._M_p;
                local_3c0._16_8_ = (local_2d0->PrimaryOutput)._M_string_length;
                local_3a0._M_allocated_capacity = 0;
                views_02._M_len = 3;
                views_02._M_array = (iterator)local_3e0;
                local_3c0._0_8_ = local_4a0.field_2._M_allocated_capacity;
                cmCatViews(&local_450,views_02);
                std::__cxx11::string::operator=((string *)pcVar2,(string *)&local_450);
                uVar13 = local_450.field_2._M_allocated_capacity;
                _Var14._M_p = local_450._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_450._M_dataplus._M_p != &local_450.field_2) goto LAB_006a9d66;
              }
            }
            else {
              local_3e0._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x26;
              local_3e0._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
              local_3e0._16_8_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              local_3c0._0_8_ = (local_458->_M_dataplus)._M_p;
              local_3e0._24_8_ = local_458->_M_string_length;
              local_3c0._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_3c0._16_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x12;
              local_3c0._24_8_ = ": invalid filename";
              local_3a0._M_allocated_capacity = 0;
              views_03._M_len = 3;
              views_03._M_array = (iterator)local_3e0;
              cmCatViews(&local_4a0,views_03);
              cmSystemTools::Error(&local_4a0);
              uVar13 = local_4a0.field_2._M_allocated_capacity;
              _Var14._M_p = local_4a0._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
LAB_006a9d66:
                operator_delete(_Var14._M_p,(ulong)(uVar13 + 1));
              }
            }
            if (!bVar4) goto LAB_006ab40f;
          }
          bVar4 = Json::Value::isMember(pVVar10,"outputs");
          if (bVar4) {
            pVVar11 = Json::Value::operator[](pVVar10,"outputs");
            bVar4 = Json::Value::isArray(pVVar11);
            if (bVar4) {
              cVar15 = Json::Value::begin(pVVar11);
              local_3f0.current_ = cVar15.super_ValueIteratorBase.current_._M_node;
              local_3f0.isNull_ = cVar15.super_ValueIteratorBase.isNull_;
              cVar15 = Json::Value::end(pVVar11);
              local_2a8.current_ = cVar15.super_ValueIteratorBase.current_._M_node;
              local_2a8.isNull_ = cVar15.super_ValueIteratorBase.isNull_;
              while (bVar4 = Json::ValueIteratorBase::isEqual(&local_3f0,&local_2a8), !bVar4) {
                pVVar11 = Json::ValueIteratorBase::deref(&local_3f0);
                local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
                local_450._M_string_length = 0;
                local_450.field_2._M_allocated_capacity =
                     local_450.field_2._M_allocated_capacity & 0xffffffffffffff00;
                bVar4 = ParseFilename(pVVar11,&local_450);
                if (bVar4) {
                  if (((local_3f8 == '\x01') &&
                      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_418._M_string_length !=
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0)) && (bVar5 = cmsys::SystemTools::FileIsFullPath(&local_450), !bVar5))
                  {
                    local_3e0._0_8_ = local_418._M_string_length;
                    local_3e0._8_8_ = local_418._M_dataplus._M_p;
                    local_3e0._16_8_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                    local_4a0._M_dataplus._M_p = (pointer)0x0;
                    local_4a0._M_string_length = (size_type)&DAT_00000001;
                    local_4a0.field_2._M_allocated_capacity = (long)&local_4a0.field_2 + 8;
                    local_4a0.field_2._M_local_buf[8] = 0x2f;
                    local_3e0._24_8_ = &DAT_00000001;
                    local_3c0._8_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
                    local_3c0._16_8_ = local_450._M_string_length;
                    local_3c0._24_8_ = local_450._M_dataplus._M_p;
                    local_3a0._M_allocated_capacity = 0;
                    views_04._M_len = 3;
                    views_04._M_array = (iterator)local_3e0;
                    local_3c0._0_8_ = local_4a0.field_2._M_allocated_capacity;
                    cmCatViews(&local_2c8,views_04);
                    std::__cxx11::string::operator=((string *)&local_450,(string *)&local_2c8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
                      operator_delete(local_2c8._M_dataplus._M_p,
                                      (ulong)(local_2c8.field_2._M_allocated_capacity + 1));
                    }
                  }
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string&>(local_288,&local_450);
                }
                else {
                  local_3e0._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x26;
                  local_3e0._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                  local_3e0._16_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                  local_3c0._0_8_ = (local_458->_M_dataplus)._M_p;
                  local_3e0._24_8_ = local_458->_M_string_length;
                  local_3c0._8_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_3c0._16_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x12;
                  local_3c0._24_8_ = ": invalid filename";
                  local_3a0._M_allocated_capacity = 0;
                  views_05._M_len = 3;
                  views_05._M_array = (iterator)local_3e0;
                  cmCatViews(&local_4a0,views_05);
                  cmSystemTools::Error(&local_4a0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
                    operator_delete(local_4a0._M_dataplus._M_p,
                                    (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_450._M_dataplus._M_p != &local_450.field_2) {
                  operator_delete(local_450._M_dataplus._M_p,
                                  (ulong)(local_450.field_2._M_allocated_capacity + 1));
                }
                if (!bVar4) goto LAB_006ab40f;
                Json::ValueIteratorBase::increment(&local_3f0);
              }
            }
          }
          bVar4 = Json::Value::isMember(pVVar10,"provides");
          if (bVar4) {
            pVVar11 = Json::Value::operator[](pVVar10,"provides");
            bVar4 = Json::Value::isArray(pVVar11);
            if (!bVar4) {
              cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[27]>
                        ((string *)local_3e0,(char (*) [39])"-E cmake_ninja_dyndep failed to parse "
                         ,local_458,(char (*) [27])": provides is not an array");
              cmSystemTools::Error((string *)local_3e0);
              goto LAB_006ab3ea;
            }
            cVar15 = Json::Value::begin(pVVar11);
            local_3f0.current_ = cVar15.super_ValueIteratorBase.current_._M_node;
            local_3f0.isNull_ = cVar15.super_ValueIteratorBase.isNull_;
            cVar15 = Json::Value::end(pVVar11);
            local_2a8.current_ = cVar15.super_ValueIteratorBase.current_._M_node;
            local_2a8.isNull_ = cVar15.super_ValueIteratorBase.isNull_;
            while (bVar4 = Json::ValueIteratorBase::isEqual(&local_3f0,&local_2a8), !bVar4) {
              pVVar11 = Json::ValueIteratorBase::deref(&local_3f0);
              local_3e0._0_8_ = local_3e0 + 0x10;
              local_3e0._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_3e0._16_8_ = local_3e0._16_8_ & 0xffffffffffffff00;
              local_3c0._0_8_ = local_3c0 + 0x10;
              local_3c0._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_3c0._16_8_ = local_3c0._16_8_ & 0xffffffffffffff00;
              local_3a0._M_allocated_capacity = (size_type)&local_390;
              local_3a0._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_390._M_allocated_capacity = local_390._M_allocated_capacity & 0xffffffffffffff00
              ;
              local_380 = 0x100;
              local_37c = ByName;
              pVVar12 = Json::Value::operator[](pVVar11,"logical-name");
              bVar5 = ParseFilename(pVVar12,(string *)local_3e0);
              if (!bVar5) {
                local_4a0._M_dataplus._M_p = (pointer)0x26;
                local_4a0._M_string_length = 0x963c79;
                local_4a0.field_2._M_allocated_capacity = 0;
                local_480 = (local_458->_M_dataplus)._M_p;
                local_4a0.field_2._8_8_ = local_458->_M_string_length;
                local_478 = 0;
                local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0xe;
                local_468 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x9881c5;
                local_460 = (String *)0x0;
                views_12._M_len = 3;
                views_12._M_array = (iterator)&local_4a0;
                cmCatViews(&local_450,views_12);
                cmSystemTools::Error(&local_450);
LAB_006aa841:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_450._M_dataplus._M_p != &local_450.field_2) {
                  operator_delete(local_450._M_dataplus._M_p,
                                  (ulong)(local_450.field_2._M_allocated_capacity + 1));
                }
LAB_006aa85d:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3a0._M_allocated_capacity != &local_390) {
                  operator_delete((void *)local_3a0._M_allocated_capacity,
                                  (ulong)(local_390._M_allocated_capacity + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3c0._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_3c0 + 0x10)) {
                  operator_delete((void *)local_3c0._0_8_,(ulong)(local_3c0._16_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3e0._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_3e0 + 0x10)) {
                  operator_delete((void *)local_3e0._0_8_,(ulong)(local_3e0._16_8_ + 1));
                }
                if (!bVar4) goto LAB_006ab40f;
                break;
              }
              bVar5 = Json::Value::isMember(pVVar11,"compiled-module-path");
              if (bVar5) {
                pVVar12 = Json::Value::operator[](pVVar11,"compiled-module-path");
                bVar5 = ParseFilename(pVVar12,(string *)&local_3a0);
                if (bVar5) {
                  if (((local_3f8 == '\x01') &&
                      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_418._M_string_length !=
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0)) &&
                     (bVar6 = cmsys::SystemTools::FileIsFullPath((string *)&local_3a0), !bVar6)) {
                    local_4a0._M_dataplus._M_p = (pointer)local_418._M_string_length;
                    local_4a0._M_string_length = (size_type)local_418._M_dataplus._M_p;
                    local_4a0.field_2._M_allocated_capacity = 0;
                    local_450._M_dataplus._M_p = (pointer)0x0;
                    local_450._M_string_length = (size_type)&DAT_00000001;
                    local_480 = (pointer)((long)&local_450.field_2 + 8);
                    local_450.field_2._M_local_buf[8] = '/';
                    local_4a0.field_2._8_8_ = 1;
                    local_478 = 0;
                    local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_3a0._8_8_;
                    local_468 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_3a0._M_allocated_capacity;
                    local_460 = (String *)0x0;
                    views_06._M_len = 3;
                    views_06._M_array = (iterator)&local_4a0;
                    local_450.field_2._M_allocated_capacity = (size_type)local_480;
                    cmCatViews(&local_2c8,views_06);
                    std::__cxx11::string::operator=
                              ((string *)local_3a0._M_local_buf,(string *)&local_2c8);
                    uVar13 = local_2c8.field_2._M_allocated_capacity;
                    _Var14._M_p = local_2c8._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) goto LAB_006aa315;
                  }
                }
                else {
                  local_4a0._M_dataplus._M_p = (pointer)0x26;
                  local_4a0._M_string_length = 0x963c79;
                  local_4a0.field_2._M_allocated_capacity = 0;
                  local_480 = (local_458->_M_dataplus)._M_p;
                  local_4a0.field_2._8_8_ = local_458->_M_string_length;
                  local_478 = 0;
                  local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x12;
                  local_468 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x988204;
                  local_460 = (String *)0x0;
                  views_07._M_len = 3;
                  views_07._M_array = (iterator)&local_4a0;
                  cmCatViews(&local_450,views_07);
                  cmSystemTools::Error(&local_450);
                  uVar13 = local_450.field_2._M_allocated_capacity;
                  _Var14._M_p = local_450._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_450._M_dataplus._M_p != &local_450.field_2) {
LAB_006aa315:
                    operator_delete(_Var14._M_p,(ulong)(uVar13 + 1));
                  }
                }
                if (bVar5) goto LAB_006aa326;
                goto LAB_006aa85d;
              }
LAB_006aa326:
              bVar5 = Json::Value::isMember(pVVar11,"unique-on-source-path");
              if (bVar5) {
                pVVar12 = Json::Value::operator[](pVVar11,"unique-on-source-path");
                bVar5 = Json::Value::isBool(pVVar12);
                if (bVar5) {
                  bVar6 = Json::Value::asBool(pVVar12);
                  local_380 = CONCAT11(local_380._1_1_,bVar6);
                }
                else {
                  local_4a0._M_dataplus._M_p = (pointer)0x26;
                  local_4a0._M_string_length = 0x963c79;
                  local_4a0.field_2._M_allocated_capacity = 0;
                  local_480 = (local_458->_M_dataplus)._M_p;
                  local_4a0.field_2._8_8_ = local_458->_M_string_length;
                  local_478 = 0;
                  local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)&DAT_00000028;
                  local_468 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x98827b;
                  local_460 = (String *)0x0;
                  views_08._M_len = 3;
                  views_08._M_array = (iterator)&local_4a0;
                  cmCatViews(&local_450,views_08);
                  cmSystemTools::Error(&local_450);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_450._M_dataplus._M_p != &local_450.field_2) {
                    operator_delete(local_450._M_dataplus._M_p,
                                    (ulong)(local_450.field_2._M_allocated_capacity + 1));
                  }
                }
                if (!bVar5) goto LAB_006aa85d;
              }
              else {
                local_380 = local_380 & 0xff00;
              }
              bVar5 = Json::Value::isMember(pVVar11,"source-path");
              if (bVar5) {
                pVVar12 = Json::Value::operator[](pVVar11,"source-path");
                bVar5 = ParseFilename(pVVar12,(string *)local_3c0);
                if (bVar5) {
                  if (((local_3f8 == '\x01') &&
                      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_418._M_string_length !=
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0)) &&
                     (bVar6 = cmsys::SystemTools::FileIsFullPath((string *)local_3c0), !bVar6)) {
                    local_4a0._M_dataplus._M_p = (pointer)local_418._M_string_length;
                    local_4a0._M_string_length = (size_type)local_418._M_dataplus._M_p;
                    local_4a0.field_2._M_allocated_capacity = 0;
                    local_450._M_dataplus._M_p = (pointer)0x0;
                    local_450._M_string_length = (size_type)&DAT_00000001;
                    local_480 = (pointer)((long)&local_450.field_2 + 8);
                    local_450.field_2._M_local_buf[8] = '/';
                    local_4a0.field_2._8_8_ = 1;
                    local_478 = 0;
                    local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_3c0._8_8_;
                    local_468 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_3c0._0_8_;
                    local_460 = (String *)0x0;
                    views_09._M_len = 3;
                    views_09._M_array = (iterator)&local_4a0;
                    local_450.field_2._M_allocated_capacity = (size_type)local_480;
                    cmCatViews(&local_2c8,views_09);
                    std::__cxx11::string::operator=((string *)local_3c0,(string *)&local_2c8);
                    uVar13 = local_2c8.field_2._M_allocated_capacity;
                    _Var14._M_p = local_2c8._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) goto LAB_006aa5d1;
                  }
                }
                else {
                  local_4a0._M_dataplus._M_p = (pointer)0x26;
                  local_4a0._M_string_length = 0x963c79;
                  local_4a0.field_2._M_allocated_capacity = 0;
                  local_480 = (local_458->_M_dataplus)._M_p;
                  local_4a0.field_2._8_8_ = local_458->_M_string_length;
                  local_478 = 0;
                  local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x12;
                  local_468 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x988204;
                  local_460 = (String *)0x0;
                  views_10._M_len = 3;
                  views_10._M_array = (iterator)&local_4a0;
                  cmCatViews(&local_450,views_10);
                  cmSystemTools::Error(&local_450);
                  uVar13 = local_450.field_2._M_allocated_capacity;
                  _Var14._M_p = local_450._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_450._M_dataplus._M_p != &local_450.field_2) {
LAB_006aa5d1:
                    operator_delete(_Var14._M_p,(ulong)(uVar13 + 1));
                  }
                }
                if (!bVar5) goto LAB_006aa85d;
              }
              else if (local_380._0_1_ == true) {
                local_4a0._M_dataplus._M_p = (pointer)0x26;
                local_4a0._M_string_length = 0x963c79;
                local_4a0.field_2._M_allocated_capacity = 0;
                local_480 = (local_458->_M_dataplus)._M_p;
                local_4a0.field_2._8_8_ = local_458->_M_string_length;
                local_478 = 0;
                local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x18;
                local_468 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x9882a4;
                local_460 = (String *)0x0;
                views_13._M_len = 3;
                views_13._M_array = (iterator)&local_4a0;
                cmCatViews(&local_450,views_13);
                cmSystemTools::Error(&local_450);
                goto LAB_006aa841;
              }
              bVar5 = Json::Value::isMember(pVVar11,"is-interface");
              if (bVar5) {
                pVVar11 = Json::Value::operator[](pVVar11,"is-interface");
                bVar5 = Json::Value::isBool(pVVar11);
                if (bVar5) {
                  bVar6 = Json::Value::asBool(pVVar11);
                  local_380 = CONCAT11(bVar6,local_380._0_1_);
                }
                else {
                  local_4a0._M_dataplus._M_p = (pointer)0x26;
                  local_4a0._M_string_length = 0x963c79;
                  local_4a0.field_2._M_allocated_capacity = 0;
                  local_480 = (local_458->_M_dataplus)._M_p;
                  local_4a0.field_2._8_8_ = local_458->_M_string_length;
                  local_478 = 0;
                  local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x1f;
                  local_468 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x9882ca;
                  local_460 = (String *)0x0;
                  views_11._M_len = 3;
                  views_11._M_array = (iterator)&local_4a0;
                  cmCatViews(&local_450,views_11);
                  cmSystemTools::Error(&local_450);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_450._M_dataplus._M_p != &local_450.field_2) {
                    operator_delete(local_450._M_dataplus._M_p,
                                    (ulong)(local_450.field_2._M_allocated_capacity + 1));
                  }
                }
                if (!bVar5) goto LAB_006aa85d;
              }
              else {
                local_380 = CONCAT11(1,local_380._0_1_);
              }
              std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::push_back
                        (local_278,(value_type *)local_3e0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a0._M_allocated_capacity != &local_390) {
                operator_delete((void *)local_3a0._M_allocated_capacity,
                                (ulong)(local_390._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3c0._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_3c0 + 0x10)) {
                operator_delete((void *)local_3c0._0_8_,(ulong)(local_3c0._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3e0._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_3e0 + 0x10)) {
                operator_delete((void *)local_3e0._0_8_,(ulong)(local_3e0._16_8_ + 1));
              }
              Json::ValueIteratorBase::increment(&local_3f0);
            }
          }
          bVar4 = Json::Value::isMember(pVVar10,"requires");
          if (bVar4) {
            pVVar10 = Json::Value::operator[](pVVar10,"requires");
            bVar4 = Json::Value::isArray(pVVar10);
            if (!bVar4) {
              cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[27]>
                        ((string *)local_3e0,(char (*) [39])"-E cmake_ninja_dyndep failed to parse "
                         ,local_458,(char (*) [27])": requires is not an array");
              cmSystemTools::Error((string *)local_3e0);
              goto LAB_006ab3ea;
            }
            cVar15 = Json::Value::begin(pVVar10);
            local_3f0.current_ = cVar15.super_ValueIteratorBase.current_._M_node;
            local_3f0.isNull_ = cVar15.super_ValueIteratorBase.isNull_;
            cVar15 = Json::Value::end(pVVar10);
            local_2a8.current_ = cVar15.super_ValueIteratorBase.current_._M_node;
            local_2a8.isNull_ = cVar15.super_ValueIteratorBase.isNull_;
            while (bVar4 = Json::ValueIteratorBase::isEqual(&local_3f0,&local_2a8), !bVar4) {
              pVVar10 = Json::ValueIteratorBase::deref(&local_3f0);
              local_3e0._0_8_ = local_3e0 + 0x10;
              local_3e0._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_3e0._16_8_ = local_3e0._16_8_ & 0xffffffffffffff00;
              local_3c0._0_8_ = local_3c0 + 0x10;
              local_3c0._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_3c0._16_8_ = local_3c0._16_8_ & 0xffffffffffffff00;
              local_3a0._M_allocated_capacity = (size_type)&local_390;
              local_3a0._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_390._M_allocated_capacity = local_390._M_allocated_capacity & 0xffffffffffffff00
              ;
              local_380 = 0x100;
              local_37c = ByName;
              pVVar11 = Json::Value::operator[](pVVar10,"logical-name");
              bVar5 = ParseFilename(pVVar11,(string *)local_3e0);
              if (!bVar5) {
                local_4a0._M_dataplus._M_p = (pointer)0x26;
                local_4a0._M_string_length = 0x963c79;
                local_4a0.field_2._M_allocated_capacity = 0;
                local_480 = (local_458->_M_dataplus)._M_p;
                local_4a0.field_2._8_8_ = local_458->_M_string_length;
                local_478 = 0;
                local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0xe;
                local_468 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x9881c5;
                local_460 = (String *)0x0;
                views_19._M_len = 3;
                views_19._M_array = (iterator)&local_4a0;
                cmCatViews(&local_450,views_19);
                cmSystemTools::Error(&local_450);
LAB_006ab1cb:
                uVar13 = local_450.field_2._M_allocated_capacity;
                _Var14._M_p = local_450._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_450._M_dataplus._M_p != &local_450.field_2) {
LAB_006ab1df:
                  operator_delete(_Var14._M_p,(ulong)(uVar13 + 1));
                }
LAB_006ab1e7:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3a0._M_allocated_capacity != &local_390) {
                  operator_delete((void *)local_3a0._M_allocated_capacity,
                                  (ulong)(local_390._M_allocated_capacity + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3c0._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_3c0 + 0x10)) {
                  operator_delete((void *)local_3c0._0_8_,(ulong)(local_3c0._16_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3e0._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_3e0 + 0x10)) {
                  operator_delete((void *)local_3e0._0_8_,(ulong)(local_3e0._16_8_ + 1));
                }
                if (!bVar4) goto LAB_006ab40f;
                break;
              }
              bVar5 = Json::Value::isMember(pVVar10,"compiled-module-path");
              if (bVar5) {
                pVVar11 = Json::Value::operator[](pVVar10,"compiled-module-path");
                bVar5 = ParseFilename(pVVar11,(string *)&local_3a0);
                if (bVar5) {
                  if (((local_3f8 == '\x01') &&
                      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_418._M_string_length !=
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0)) &&
                     (bVar6 = cmsys::SystemTools::FileIsFullPath((string *)&local_3a0), !bVar6)) {
                    local_4a0._M_dataplus._M_p = (pointer)local_418._M_string_length;
                    local_4a0._M_string_length = (size_type)local_418._M_dataplus._M_p;
                    local_4a0.field_2._M_allocated_capacity = 0;
                    local_450._M_dataplus._M_p = (pointer)0x0;
                    local_450._M_string_length = (size_type)&DAT_00000001;
                    local_480 = (pointer)((long)&local_450.field_2 + 8);
                    local_450.field_2._M_local_buf[8] = '/';
                    local_4a0.field_2._8_8_ = 1;
                    local_478 = 0;
                    local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_3a0._8_8_;
                    local_468 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_3a0._M_allocated_capacity;
                    local_460 = (String *)0x0;
                    views_14._M_len = 3;
                    views_14._M_array = (iterator)&local_4a0;
                    local_450.field_2._M_allocated_capacity = (size_type)local_480;
                    cmCatViews(&local_2c8,views_14);
                    std::__cxx11::string::operator=
                              ((string *)local_3a0._M_local_buf,(string *)&local_2c8);
                    uVar13 = local_2c8.field_2._M_allocated_capacity;
                    _Var14._M_p = local_2c8._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) goto LAB_006aabb7;
                  }
                }
                else {
                  local_4a0._M_dataplus._M_p = (pointer)0x26;
                  local_4a0._M_string_length = 0x963c79;
                  local_4a0.field_2._M_allocated_capacity = 0;
                  local_480 = (local_458->_M_dataplus)._M_p;
                  local_4a0.field_2._8_8_ = local_458->_M_string_length;
                  local_478 = 0;
                  local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x12;
                  local_468 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x988204;
                  local_460 = (String *)0x0;
                  views_15._M_len = 3;
                  views_15._M_array = (iterator)&local_4a0;
                  cmCatViews(&local_450,views_15);
                  cmSystemTools::Error(&local_450);
                  uVar13 = local_450.field_2._M_allocated_capacity;
                  _Var14._M_p = local_450._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_450._M_dataplus._M_p != &local_450.field_2) {
LAB_006aabb7:
                    operator_delete(_Var14._M_p,(ulong)(uVar13 + 1));
                  }
                }
                if (bVar5) goto LAB_006aabc8;
                goto LAB_006ab1e7;
              }
LAB_006aabc8:
              bVar5 = Json::Value::isMember(pVVar10,"unique-on-source-path");
              if (bVar5) {
                pVVar11 = Json::Value::operator[](pVVar10,"unique-on-source-path");
                bVar5 = Json::Value::isBool(pVVar11);
                if (bVar5) {
                  bVar6 = Json::Value::asBool(pVVar11);
                  local_380 = CONCAT11(local_380._1_1_,bVar6);
                }
                else {
                  local_4a0._M_dataplus._M_p = (pointer)0x26;
                  local_4a0._M_string_length = 0x963c79;
                  local_4a0.field_2._M_allocated_capacity = 0;
                  local_480 = (local_458->_M_dataplus)._M_p;
                  local_4a0.field_2._8_8_ = local_458->_M_string_length;
                  local_478 = 0;
                  local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)&DAT_00000028;
                  local_468 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x98827b;
                  local_460 = (String *)0x0;
                  views_16._M_len = 3;
                  views_16._M_array = (iterator)&local_4a0;
                  cmCatViews(&local_450,views_16);
                  cmSystemTools::Error(&local_450);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_450._M_dataplus._M_p != &local_450.field_2) {
                    operator_delete(local_450._M_dataplus._M_p,
                                    (ulong)(local_450.field_2._M_allocated_capacity + 1));
                  }
                }
                if (!bVar5) goto LAB_006ab1e7;
              }
              else {
                local_380 = local_380 & 0xff00;
              }
              bVar5 = Json::Value::isMember(pVVar10,"source-path");
              if (bVar5) {
                pVVar11 = Json::Value::operator[](pVVar10,"source-path");
                bVar5 = ParseFilename(pVVar11,(string *)local_3c0);
                if (bVar5) {
                  if (((local_3f8 == '\x01') &&
                      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_418._M_string_length !=
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0)) &&
                     (bVar6 = cmsys::SystemTools::FileIsFullPath((string *)local_3c0), !bVar6)) {
                    local_4a0._M_dataplus._M_p = (pointer)local_418._M_string_length;
                    local_4a0._M_string_length = (size_type)local_418._M_dataplus._M_p;
                    local_4a0.field_2._M_allocated_capacity = 0;
                    local_450._M_dataplus._M_p = (pointer)0x0;
                    local_450._M_string_length = (size_type)&DAT_00000001;
                    local_480 = (pointer)((long)&local_450.field_2 + 8);
                    local_450.field_2._M_local_buf[8] = '/';
                    local_4a0.field_2._8_8_ = 1;
                    local_478 = 0;
                    local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_3c0._8_8_;
                    local_468 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_3c0._0_8_;
                    local_460 = (String *)0x0;
                    views_17._M_len = 3;
                    views_17._M_array = (iterator)&local_4a0;
                    local_450.field_2._M_allocated_capacity = (size_type)local_480;
                    cmCatViews(&local_2c8,views_17);
                    std::__cxx11::string::operator=((string *)local_3c0,(string *)&local_2c8);
                    uVar13 = local_2c8.field_2._M_allocated_capacity;
                    _Var14._M_p = local_2c8._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) goto LAB_006aae73;
                  }
                }
                else {
                  local_4a0._M_dataplus._M_p = (pointer)0x26;
                  local_4a0._M_string_length = 0x963c79;
                  local_4a0.field_2._M_allocated_capacity = 0;
                  local_480 = (local_458->_M_dataplus)._M_p;
                  local_4a0.field_2._8_8_ = local_458->_M_string_length;
                  local_478 = 0;
                  local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x12;
                  local_468 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x988204;
                  local_460 = (String *)0x0;
                  views_18._M_len = 3;
                  views_18._M_array = (iterator)&local_4a0;
                  cmCatViews(&local_450,views_18);
                  cmSystemTools::Error(&local_450);
                  uVar13 = local_450.field_2._M_allocated_capacity;
                  _Var14._M_p = local_450._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_450._M_dataplus._M_p != &local_450.field_2) {
LAB_006aae73:
                    operator_delete(_Var14._M_p,(ulong)(uVar13 + 1));
                  }
                }
                if (!bVar5) goto LAB_006ab1e7;
              }
              else if (local_380._0_1_ == true) {
                local_4a0._M_dataplus._M_p = (pointer)0x26;
                local_4a0._M_string_length = 0x963c79;
                local_4a0.field_2._M_allocated_capacity = 0;
                local_480 = (local_458->_M_dataplus)._M_p;
                local_4a0.field_2._8_8_ = local_458->_M_string_length;
                local_478 = 0;
                local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x18;
                local_468 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x9882a4;
                local_460 = (String *)0x0;
                views_20._M_len = 3;
                views_20._M_array = (iterator)&local_4a0;
                cmCatViews(&local_450,views_20);
                cmSystemTools::Error(&local_450);
                goto LAB_006ab1cb;
              }
              bVar5 = Json::Value::isMember(pVVar10,"lookup-method");
              if (bVar5) {
                pVVar10 = Json::Value::operator[](pVVar10,"lookup-method");
                bVar5 = Json::Value::isString(pVVar10);
                if (!bVar5) {
                  local_4a0._M_dataplus._M_p = (pointer)0x26;
                  local_4a0._M_string_length = 0x963c79;
                  local_4a0.field_2._M_allocated_capacity = 0;
                  local_480 = (local_458->_M_dataplus)._M_p;
                  local_4a0.field_2._8_8_ = local_458->_M_string_length;
                  local_478 = 0;
                  local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x1f;
                  local_468 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x988305;
                  local_460 = (String *)0x0;
                  views_21._M_len = 3;
                  views_21._M_array = (iterator)&local_4a0;
                  cmCatViews(&local_450,views_21);
                  cmSystemTools::Error(&local_450);
                  goto LAB_006ab1cb;
                }
                Json::Value::asString_abi_cxx11_(&local_4a0,pVVar10);
                sVar1 = local_4a0._M_string_length;
                _Var14._M_p = local_4a0._M_dataplus._M_p;
                if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_4a0._M_string_length ==
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x7) && (iVar9 = bcmp(local_4a0._M_dataplus._M_p,"by-name",7), iVar9 == 0))
                {
                  LVar3 = ByName;
                }
                else {
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)sVar1 !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0xd) {
LAB_006ab087:
                    cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[33],std::__cxx11::string&>
                              (&local_450,(char (*) [39])"-E cmake_ninja_dyndep failed to parse ",
                               local_458,(char (*) [33])": lookup-method is not a valid: ",
                               &local_4a0);
                    cmSystemTools::Error(&local_450);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_450._M_dataplus._M_p != &local_450.field_2) {
                      operator_delete(local_450._M_dataplus._M_p,
                                      (ulong)(local_450.field_2._M_allocated_capacity + 1));
                    }
                    uVar13 = local_4a0.field_2._M_allocated_capacity;
                    _Var14._M_p = local_4a0._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) goto LAB_006ab1df;
                    goto LAB_006ab1e7;
                  }
                  iVar9 = bcmp(_Var14._M_p,"include-angle",0xd);
                  if (iVar9 == 0) {
                    LVar3 = IncludeAngle;
                  }
                  else {
                    iVar9 = bcmp(_Var14._M_p,"include-quote",0xd);
                    LVar3 = IncludeQuote;
                    if (iVar9 != 0) goto LAB_006ab087;
                  }
                }
                local_37c = LVar3;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var14._M_p != &local_4a0.field_2) {
                  operator_delete(_Var14._M_p,(ulong)(local_4a0.field_2._M_allocated_capacity + 1));
                }
              }
              else if (local_380._0_1_ == true) {
                local_37c = ByName;
              }
              std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::push_back
                        (local_280,(value_type *)local_3e0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a0._M_allocated_capacity != &local_390) {
                operator_delete((void *)local_3a0._M_allocated_capacity,
                                (ulong)(local_390._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3c0._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_3c0 + 0x10)) {
                operator_delete((void *)local_3c0._0_8_,(ulong)(local_3c0._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3e0._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_3e0 + 0x10)) {
                operator_delete((void *)local_3e0._0_8_,(ulong)(local_3e0._16_8_ + 1));
              }
              Json::ValueIteratorBase::increment(&local_3f0);
            }
          }
          if ((local_3f8 == '\x01') &&
             (local_3f8 = '\0',
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_418._M_dataplus._M_p != &local_418.field_2)) {
            operator_delete(local_418._M_dataplus._M_p,
                            (ulong)(local_418.field_2._M_allocated_capacity + 1));
          }
          Json::ValueIteratorBase::increment(&local_298);
        }
      }
      bVar4 = true;
      goto LAB_006ab2ad;
    }
    Json::Value::asString_abi_cxx11_(&local_450,pVVar10);
    local_3e0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x26;
    local_3e0._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
    local_3e0._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_3c0._0_8_ = (local_458->_M_dataplus)._M_p;
    local_3e0._24_8_ = local_458->_M_string_length;
    local_3c0._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_3c0._16_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0xa;
    local_3c0._24_8_ = ": version ";
    local_3a0._M_allocated_capacity = 0;
    local_3a0._8_8_ = local_450._M_string_length;
    local_390._M_allocated_capacity = (size_type)local_450._M_dataplus._M_p;
    views_00._M_len = 4;
    views_00._M_array = (iterator)local_3e0;
    local_390._8_8_ = &local_450;
    cmCatViews(&local_4a0,views_00);
    cmSystemTools::Error(&local_4a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
      operator_delete(local_4a0._M_dataplus._M_p,
                      (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
    }
    local_418.field_2._M_allocated_capacity = local_450.field_2._M_allocated_capacity;
    local_418._M_dataplus._M_p = local_450._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
LAB_006a9977:
      operator_delete(local_418._M_dataplus._M_p,
                      (ulong)(local_418.field_2._M_allocated_capacity + 1));
    }
  }
  else {
    Json::Reader::getFormattedErrorMessages_abi_cxx11_(&local_418,(Reader *)local_3e0);
    local_4a0._M_dataplus._M_p = (pointer)0x26;
    local_4a0._M_string_length = 0x963c79;
    local_4a0.field_2._M_allocated_capacity = 0;
    local_480 = (local_458->_M_dataplus)._M_p;
    local_4a0.field_2._8_8_ = local_458->_M_string_length;
    local_478 = 0;
    local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_string_length;
    local_468 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_dataplus._M_p;
    views._M_len = 3;
    views._M_array = (iterator)&local_4a0;
    local_460 = &local_418;
    cmCatViews(&local_450,views);
    cmSystemTools::Error(&local_450);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,
                      (ulong)(local_450.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p != &local_418.field_2) {
      operator_delete(local_418._M_dataplus._M_p,
                      (ulong)(local_418.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_p != &local_2e8) {
      operator_delete(local_2f8._M_p,local_2e8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_p != local_330) {
      operator_delete(local_340._M_p,local_330[0]._M_allocated_capacity + 1);
    }
    std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
              ((deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *)
               &local_390);
    std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
              ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)local_3e0);
    if (bVar4) goto LAB_006a9893;
  }
LAB_006a997f:
  bVar4 = false;
LAB_006ab2ad:
  std::ifstream::~ifstream(&local_238);
  Json::Value::~Value(&local_270);
  return bVar4;
}

Assistant:

bool cmScanDepFormat_P1689_Parse(std::string const& arg_pp,
                                 cmScanDepInfo* info)
{
  Json::Value ppio;
  Json::Value const& ppi = ppio;
  cmsys::ifstream ppf(arg_pp.c_str(), std::ios::in | std::ios::binary);
  {
    Json::Reader reader;
    if (!reader.parse(ppf, ppio, false)) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                    arg_pp,
                                    reader.getFormattedErrorMessages()));
      return false;
    }
  }

  Json::Value const& version = ppi["version"];
  if (version.asUInt() > 1) {
    cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                  arg_pp, ": version ", version.asString()));
    return false;
  }

  Json::Value const& rules = ppi["rules"];
  if (rules.isArray()) {
    if (rules.size() != 1) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                    arg_pp, ": expected 1 source entry"));
      return false;
    }

    for (auto const& rule : rules) {
      cm::optional<std::string> work_directory;
      Json::Value const& workdir = rule["work-directory"];
      if (workdir.isString()) {
        std::string wd;
        PARSE_BLOB(workdir, wd);
        work_directory = std::move(wd);
      } else if (!workdir.isNull()) {
        cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                      arg_pp,
                                      ": work-directory is not a string"));
        return false;
      }

      if (rule.isMember("primary-output")) {
        Json::Value const& primary_output = rule["primary-output"];
        PARSE_FILENAME(primary_output, info->PrimaryOutput);
      }

      if (rule.isMember("outputs")) {
        Json::Value const& outputs = rule["outputs"];
        if (outputs.isArray()) {
          for (auto const& output : outputs) {
            std::string extra_output;
            PARSE_FILENAME(output, extra_output);

            info->ExtraOutputs.emplace_back(extra_output);
          }
        }
      }

      if (rule.isMember("provides")) {
        Json::Value const& provides = rule["provides"];
        if (!provides.isArray()) {
          cmSystemTools::Error(
            cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                     ": provides is not an array"));
          return false;
        }

        for (auto const& provide : provides) {
          cmSourceReqInfo provide_info;

          Json::Value const& logical_name = provide["logical-name"];
          PARSE_BLOB(logical_name, provide_info.LogicalName);

          if (provide.isMember("compiled-module-path")) {
            Json::Value const& compiled_module_path =
              provide["compiled-module-path"];
            PARSE_FILENAME(compiled_module_path,
                           provide_info.CompiledModulePath);
          }

          if (provide.isMember("unique-on-source-path")) {
            Json::Value const& unique_on_source_path =
              provide["unique-on-source-path"];
            if (!unique_on_source_path.isBool()) {
              cmSystemTools::Error(
                cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                         ": unique-on-source-path is not a boolean"));
              return false;
            }
            provide_info.UseSourcePath = unique_on_source_path.asBool();
          } else {
            provide_info.UseSourcePath = false;
          }

          if (provide.isMember("source-path")) {
            Json::Value const& source_path = provide["source-path"];
            PARSE_FILENAME(source_path, provide_info.SourcePath);
          } else if (provide_info.UseSourcePath) {
            cmSystemTools::Error(
              cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                       ": source-path is missing"));
            return false;
          }

          if (provide.isMember("is-interface")) {
            Json::Value const& is_interface = provide["is-interface"];
            if (!is_interface.isBool()) {
              cmSystemTools::Error(
                cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                         ": is-interface is not a boolean"));
              return false;
            }
            provide_info.IsInterface = is_interface.asBool();
          } else {
            provide_info.IsInterface = true;
          }

          info->Provides.push_back(provide_info);
        }
      }

      if (rule.isMember("requires")) {
        Json::Value const& reqs = rule["requires"];
        if (!reqs.isArray()) {
          cmSystemTools::Error(
            cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                     ": requires is not an array"));
          return false;
        }

        for (auto const& require : reqs) {
          cmSourceReqInfo require_info;

          Json::Value const& logical_name = require["logical-name"];
          PARSE_BLOB(logical_name, require_info.LogicalName);

          if (require.isMember("compiled-module-path")) {
            Json::Value const& compiled_module_path =
              require["compiled-module-path"];
            PARSE_FILENAME(compiled_module_path,
                           require_info.CompiledModulePath);
          }

          if (require.isMember("unique-on-source-path")) {
            Json::Value const& unique_on_source_path =
              require["unique-on-source-path"];
            if (!unique_on_source_path.isBool()) {
              cmSystemTools::Error(
                cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                         ": unique-on-source-path is not a boolean"));
              return false;
            }
            require_info.UseSourcePath = unique_on_source_path.asBool();
          } else {
            require_info.UseSourcePath = false;
          }

          if (require.isMember("source-path")) {
            Json::Value const& source_path = require["source-path"];
            PARSE_FILENAME(source_path, require_info.SourcePath);
          } else if (require_info.UseSourcePath) {
            cmSystemTools::Error(
              cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                       ": source-path is missing"));
            return false;
          }

          if (require.isMember("lookup-method")) {
            Json::Value const& lookup_method = require["lookup-method"];
            if (!lookup_method.isString()) {
              cmSystemTools::Error(
                cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                         ": lookup-method is not a string"));
              return false;
            }

            std::string lookup_method_str = lookup_method.asString();
            if (lookup_method_str == "by-name"_s) {
              require_info.Method = LookupMethod::ByName;
            } else if (lookup_method_str == "include-angle"_s) {
              require_info.Method = LookupMethod::IncludeAngle;
            } else if (lookup_method_str == "include-quote"_s) {
              require_info.Method = LookupMethod::IncludeQuote;
            } else {
              cmSystemTools::Error(cmStrCat(
                "-E cmake_ninja_dyndep failed to parse ", arg_pp,
                ": lookup-method is not a valid: ", lookup_method_str));
              return false;
            }
          } else if (require_info.UseSourcePath) {
            require_info.Method = LookupMethod::ByName;
          }

          info->Requires.push_back(require_info);
        }
      }
    }
  }

  return true;
}